

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O0

void __thiscall HighsLogOptions::clear(HighsLogOptions *this)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *in_RDI;
  nullptr_t in_stack_ffffffffffffffe8;
  
  *(undefined8 *)&(in_RDI->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(in_RDI->super__Function_base)._M_functor + 8) = 0;
  (in_RDI->super__Function_base)._M_manager = (_Manager_type)0x0;
  in_RDI->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&in_RDI[1].super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&in_RDI[1].super__Function_base._M_functor + 8) = 0;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::operator=(in_RDI,in_stack_ffffffffffffffe8);
  in_RDI[2].super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined1 *)&in_RDI[2]._M_invoker = 0;
  return;
}

Assistant:

void HighsLogOptions::clear() {
  this->log_stream = nullptr;
  this->output_flag = nullptr;
  this->log_to_console = nullptr;
  this->log_dev_level = nullptr;
  this->user_log_callback = nullptr;
  this->user_log_callback_data = nullptr;
  this->user_callback = nullptr;
  this->user_callback_data = nullptr;
  this->user_callback_active = false;
}